

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

optional_ptr<duckdb::SchemaCatalogEntry,_true>
duckdb::Catalog::GetSchema
          (CatalogEntryRetriever *retriever,string *catalog_name,EntryLookupInfo *schema_lookup,
          OnEntryNotFound if_not_found)

{
  QueryErrorContext error_context;
  pointer pCVar1;
  pointer pCVar2;
  reference catalog_name_00;
  Catalog *this;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> oVar3;
  CatalogException *this_00;
  OnEntryNotFound if_not_found_00;
  undefined7 in_register_00000009;
  ulong __n;
  allocator local_95;
  undefined4 local_94;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  optional_ptr<duckdb::Catalog,_true> catalog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetCatalogEntries(&entries,retriever,catalog_name,schema_lookup->name);
  __n = 0;
  local_94 = (undefined4)CONCAT71(in_register_00000009,if_not_found);
  do {
    while( true ) {
      if ((ulong)((long)entries.
                        super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                        .
                        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)entries.
                        super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                        .
                        super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6) <= __n) {
        if ((char)local_94 == '\0') {
          this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
          error_context.query_location.index =
               (optional_idx)(schema_lookup->error_context).query_location.index;
          ::std::__cxx11::string::string
                    ((string *)&catalog,"Catalog with name %s does not exist!",&local_95);
          ::std::__cxx11::string::string((string *)&local_50,(string *)catalog_name);
          CatalogException::CatalogException<std::__cxx11::string>
                    (this_00,error_context,(string *)&catalog,&local_50);
          __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
        oVar3.ptr = (SchemaCatalogEntry *)0x0;
        goto LAB_01244ac5;
      }
      catalog_name_00 = vector<duckdb::CatalogSearchEntry,_true>::get<true>(&entries,__n);
      catalog = GetCatalogEntry(retriever,&catalog_name_00->catalog);
      pCVar2 = entries.
               super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               .
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar1 = entries.
               super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               .
               super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (catalog.ptr != (Catalog *)0x0) break;
      __n = __n + 1;
    }
    this = optional_ptr<duckdb::Catalog,_true>::operator->(&catalog);
    __n = __n + 1;
    if_not_found_00 = RETURN_NULL;
    if (__n == (long)pCVar2 - (long)pCVar1 >> 6) {
      if_not_found_00 = if_not_found;
    }
    oVar3 = GetSchema(this,retriever->context,schema_lookup,if_not_found_00);
  } while (oVar3.ptr == (SchemaCatalogEntry *)0x0);
LAB_01244ac5:
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&entries.
              super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>)
  ;
  return (optional_ptr<duckdb::SchemaCatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<SchemaCatalogEntry> Catalog::GetSchema(CatalogEntryRetriever &retriever, const string &catalog_name,
                                                    const EntryLookupInfo &schema_lookup,
                                                    OnEntryNotFound if_not_found) {
	auto entries = GetCatalogEntries(retriever, catalog_name, schema_lookup.GetEntryName());
	for (idx_t i = 0; i < entries.size(); i++) {
		auto catalog = Catalog::GetCatalogEntry(retriever, entries[i].catalog);
		if (!catalog) {
			// skip if it is not an attached database
			continue;
		}
		const auto on_not_found = i + 1 == entries.size() ? if_not_found : OnEntryNotFound::RETURN_NULL;
		auto result = catalog->GetSchema(retriever.GetContext(), schema_lookup, on_not_found);
		if (result) {
			return result;
		}
	}
	// Catalog has not been found.
	if (if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
		throw CatalogException(schema_lookup.GetErrorContext(), "Catalog with name %s does not exist!", catalog_name);
	}
	return nullptr;
}